

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeInitPage(MemPage *pPage)

{
  BtShared *pBVar1;
  int iVar2;
  byte *pbVar3;
  BtShared *pBt;
  u8 *data;
  MemPage *pPage_local;
  
  pBVar1 = pPage->pBt;
  pbVar3 = pPage->aData + (int)(uint)pPage->hdrOffset;
  iVar2 = decodeFlags(pPage,(uint)*pbVar3);
  if (iVar2 == 0) {
    pPage->maskPage = (short)pBVar1->pageSize - 1;
    pPage->nOverflow = '\0';
    pPage->cellOffset = pPage->hdrOffset + 8 + (ushort)pPage->childPtrSize;
    pPage->aCellIdx = pbVar3 + (long)(int)(uint)pPage->childPtrSize + 8;
    pPage->aDataEnd = pPage->aData + pBVar1->usableSize;
    pPage->aDataOfst = pPage->aData + (int)(uint)pPage->childPtrSize;
    pPage->nCell = CONCAT11(pbVar3[3],pbVar3[4]);
    if ((pBVar1->pageSize - 8) / 6 < (uint)pPage->nCell) {
      pPage_local._4_4_ = sqlite3CorruptError(0xfeaf);
    }
    else {
      pPage->nFree = -1;
      pPage->isInit = '\x01';
      if ((pBVar1->db->flags & 0x200000) == 0) {
        pPage_local._4_4_ = 0;
      }
      else {
        pPage_local._4_4_ = btreeCellSizeCheck(pPage);
      }
    }
  }
  else {
    pPage_local._4_4_ = sqlite3CorruptError(0xfea1);
  }
  return pPage_local._4_4_;
}

Assistant:

static int btreeInitPage(MemPage *pPage){
  u8 *data;          /* Equal to pPage->aData */
  BtShared *pBt;        /* The main btree structure */

  assert( pPage->pBt!=0 );
  assert( pPage->pBt->db!=0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->pgno==sqlite3PagerPagenumber(pPage->pDbPage) );
  assert( pPage == sqlite3PagerGetExtra(pPage->pDbPage) );
  assert( pPage->aData == sqlite3PagerGetData(pPage->pDbPage) );
  assert( pPage->isInit==0 );

  pBt = pPage->pBt;
  data = pPage->aData + pPage->hdrOffset;
  /* EVIDENCE-OF: R-28594-02890 The one-byte flag at offset 0 indicating
  ** the b-tree page type. */
  if( decodeFlags(pPage, data[0]) ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( pBt->pageSize>=512 && pBt->pageSize<=65536 );
  pPage->maskPage = (u16)(pBt->pageSize - 1);
  pPage->nOverflow = 0;
  pPage->cellOffset = pPage->hdrOffset + 8 + pPage->childPtrSize;
  pPage->aCellIdx = data + pPage->childPtrSize + 8;
  pPage->aDataEnd = pPage->aData + pBt->usableSize;
  pPage->aDataOfst = pPage->aData + pPage->childPtrSize;
  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  pPage->nCell = get2byte(&data[3]);
  if( pPage->nCell>MX_CELL(pBt) ){
    /* To many cells for a single page.  The page must be corrupt */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  testcase( pPage->nCell==MX_CELL(pBt) );
  /* EVIDENCE-OF: R-24089-57979 If a page contains no cells (which is only
  ** possible for a root page of a table that contains no rows) then the
  ** offset to the cell content area will equal the page size minus the
  ** bytes of reserved space. */
  assert( pPage->nCell>0
       || get2byteNotZero(&data[5])==(int)pBt->usableSize
       || CORRUPT_DB );
  pPage->nFree = -1;  /* Indicate that this value is yet uncomputed */
  pPage->isInit = 1;
  if( pBt->db->flags & SQLITE_CellSizeCk ){
    return btreeCellSizeCheck(pPage);
  }
  return SQLITE_OK;
}